

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::push_back
          (compressed_sparse_matrix<filtration_entry_t> *this,filtration_entry_t e)

{
  size_type sVar1;
  _Elt_pointer puVar2;
  value_type local_18;
  
  local_18.super_pair<float,_long>.second = e.super_pair<float,_long>.second;
  local_18.super_pair<float,_long>.first = e.super_pair<float,_long>.first;
  sVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bounds);
  if (sVar1 != 0) {
    std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::push_back
              (&this->entries,&local_18);
    puVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    puVar2[-1] = puVar2[-1] + 1;
    return;
  }
  __assert_fail("0 < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xbb,
                "void compressed_sparse_matrix<filtration_entry_t>::push_back(ValueType) [ValueType = filtration_entry_t]"
               );
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}